

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

bool __thiscall Js::RecyclableObjectDisplay::IsSymbolProperty(RecyclableObjectDisplay *this)

{
  code *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined4 *puVar4;
  PropertyRecord *pPVar5;
  
  if (this->scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x77b,"(this->scriptContext)","this->scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (this->propertyId == -1) {
    uVar3 = 0;
  }
  else {
    pPVar5 = ThreadContext::GetPropertyName(this->scriptContext->threadContext,this->propertyId);
    uVar3 = pPVar5->isSymbol;
  }
  return (bool)uVar3;
}

Assistant:

bool RecyclableObjectDisplay::IsSymbolProperty()
    {
        Assert(this->scriptContext);

        if (this->propertyId != Constants::NoProperty)
        {
            Js::PropertyRecord const * propertyRecord = this->scriptContext->GetThreadContext()->GetPropertyName(this->propertyId);
            return propertyRecord->IsSymbol();
        }

        return false;
    }